

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O0

int find_real_roots_sturm(double *p,int order,double *roots,int *nroots,int maxpow,bool non_neg)

{
  int iVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  poly *sseq_00;
  double __x;
  int i_1;
  double mult;
  double fac;
  double val0;
  double norm;
  int atmax;
  int atmin;
  int np;
  int nchanges;
  int i;
  double max;
  double min;
  poly sseq [65];
  int local_8694;
  double local_8690;
  double local_8688;
  int in_stack_ffffffffffff7990;
  int in_stack_ffffffffffff7994;
  int in_stack_ffffffffffff7998;
  int iVar2;
  int iVar3;
  poly *sseq_01;
  double dVar4;
  double local_8640 [4290];
  byte local_2d;
  int local_2c;
  int *local_28;
  long local_20;
  int local_14;
  int local_4;
  
  local_2d = in_R9B & 1;
  sseq_00 = (poly *)(1.0 / *(double *)(in_RDI + (long)in_ESI * 8));
  for (iVar2 = 0; iVar2 <= in_ESI; iVar2 = iVar2 + 1) {
    local_8640[iVar2] = *(double *)(in_RDI + (long)iVar2 * 8) * (double)sseq_00;
  }
  __x = ABS(local_8640[0]);
  local_8688 = 1.0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (10.0 < __x) {
    local_14 = in_ESI;
    local_8688 = pow(__x,-1.0 / (double)in_ESI);
    local_8690 = local_8688;
    while (local_8694 = local_14 + -1, -1 < local_8694) {
      local_8640[local_8694] = local_8690 * local_8640[local_8694];
      local_8690 = local_8690 * local_8688;
      local_14 = local_8694;
    }
  }
  iVar1 = buildsturm(in_stack_ffffffffffff7994,sseq_00);
  iVar2 = numroots(iVar2,(poly *)CONCAT44(iVar1,in_stack_ffffffffffff7998),
                   (int *)CONCAT44(in_stack_ffffffffffff7994,in_stack_ffffffffffff7990),
                   &sseq_00->ord,SUB81((ulong)__x >> 0x38,0));
  *local_28 = iVar2;
  if (*local_28 == 0) {
    local_4 = 0;
  }
  else {
    if ((local_2d & 1) == 0) {
      dVar4 = -1.0;
      iVar2 = numchanges(in_stack_ffffffffffff7994,sseq_00,__x);
      for (iVar3 = 0; iVar2 != in_stack_ffffffffffff7998 && iVar3 != local_2c; iVar3 = iVar3 + 1) {
        dVar4 = dVar4 * 10.0;
        iVar2 = numchanges(in_stack_ffffffffffff7994,sseq_00,__x);
      }
      if (iVar2 != in_stack_ffffffffffff7998) {
        in_stack_ffffffffffff7998 = iVar2;
      }
    }
    else {
      dVar4 = 0.0;
    }
    sseq_01 = (poly *)0x3ff0000000000000;
    iVar2 = numchanges(in_stack_ffffffffffff7994,sseq_00,__x);
    for (iVar3 = 0; iVar2 != in_stack_ffffffffffff7994 && iVar3 != local_2c; iVar3 = iVar3 + 1) {
      sseq_01 = (poly *)((double)sseq_01 * 10.0);
      iVar2 = numchanges(in_stack_ffffffffffff7994,sseq_00,__x);
    }
    if (iVar2 != in_stack_ffffffffffff7994) {
      in_stack_ffffffffffff7994 = iVar2;
    }
    *local_28 = in_stack_ffffffffffff7998 - in_stack_ffffffffffff7994;
    sbisect(SUB84(dVar4,0),sseq_01,(double)CONCAT44(iVar3,iVar2),
            (double)CONCAT44(iVar1,in_stack_ffffffffffff7998),in_stack_ffffffffffff7994,
            in_stack_ffffffffffff7990,(double *)sseq_00);
    for (iVar2 = 0; iVar2 < *local_28; iVar2 = iVar2 + 1) {
      *(double *)(local_20 + (long)iVar2 * 8) = *(double *)(local_20 + (long)iVar2 * 8) / local_8688
      ;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int find_real_roots_sturm( 
	double *p, int order, double *roots, int *nroots, int maxpow, bool non_neg)
   {
   /*
    * finds the roots of the input polynomial.  They are returned in roots.
    * It is assumed that roots is already allocated with space for the roots.
    */

   poly sseq[Maxdegree+1];
   double  min, max;
   int  i, nchanges, np, atmin, atmax;

   // Copy the coefficients from the input p.  Normalize as we go
   double norm = 1.0 / p[order];
   for (i=0; i<=order; i++)
      sseq[0].coef[i] =  p[i] * norm;

   // Now, also normalize the other terms
   double val0 = fabs(sseq[0].coef[0]);
   double fac = 1.0; // This will be a factor for the roots
   if (val0 > 10.0)  // Do this in case there are zero roots
      {
      fac = pow(val0, -1.0/order);
      double mult = fac;
      for (int i=order-1; i>=0; i--)
         {
         sseq[0].coef[i] *= mult;
         mult = mult * fac; 
         }
      }

   /* build the Sturm sequence */
   np = buildsturm(order, sseq);

#ifdef RH_DEBUG
   {
   int i, j;

   printf("Sturm sequence for:\n");
   for (i=order; i>=0; i--)
      printf("%lf ", sseq[0].coef[i]);
   printf("\n\n");

   for (i = 0; i <= np; i++) {
      for (j = sseq[i].ord; j >= 0; j--)
         printf("%10f ", sseq[i].coef[j]);
      printf("\n");
      }

   printf("\n");
   }
#endif

   // get the number of real roots
   *nroots = numroots(np, sseq, &atmin, &atmax, non_neg);

   if (*nroots == 0) {
      // fprintf(stderr, "solve: no real roots\n");
      return 0 ;
      }

   /* calculate the bracket that the roots live in */
   if (non_neg) min = 0.0;
   else
      {
      min = -1.0;
      nchanges = numchanges(np, sseq, min);
      for (i = 0; nchanges != atmin && i != maxpow; i++) { 
         min *= 10.0;
         nchanges = numchanges(np, sseq, min);
         }

      if (nchanges != atmin) {
         //printf("solve: unable to bracket all negative roots\n");
         atmin = nchanges;
         }
      }

   max = 1.0;
   nchanges = numchanges(np, sseq, max);
   for (i = 0; nchanges != atmax && i != maxpow; i++) { 
      max *= 10.0;
      nchanges = numchanges(np, sseq, max);
      }

   if (nchanges != atmax) {
      //printf("solve: unable to bracket all positive roots\n");
      atmax = nchanges;
      }

   *nroots = atmin - atmax;

   /* perform the bisection */
   sbisect(np, sseq, min, max, atmin, atmax, roots);

   /* Finally, reorder the roots */
   for (i=0; i<*nroots; i++)
      roots[i] /= fac;

#ifdef RH_DEBUG

   /* write out the roots */
   printf("Number of roots = %d\n", *nroots);
   for (i=0; i<*nroots; i++)
      printf("%12.5e\n", roots[i]);

#endif

   return 1; 
   }